

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::LimitingInputStream::ReadCord(LimitingInputStream *this,Cord *cord,int count)

{
  ZeroCopyInputStream *pZVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  
  if (count < 1) {
    bVar5 = true;
  }
  else {
    uVar6 = (ulong)(uint)count;
    pZVar1 = this->input_;
    uVar2 = this->limit_;
    bVar5 = (long)uVar6 <= (long)uVar2;
    if ((long)uVar2 < (long)uVar6) {
      (*pZVar1->_vptr_ZeroCopyInputStream[6])(pZVar1,cord,uVar2 & 0xffffffff);
      lVar4 = 0;
    }
    else {
      iVar3 = (*pZVar1->_vptr_ZeroCopyInputStream[6])();
      if ((char)iVar3 == '\0') {
        return false;
      }
      lVar4 = this->limit_ - uVar6;
    }
    this->limit_ = lVar4;
  }
  return bVar5;
}

Assistant:

bool LimitingInputStream::ReadCord(absl::Cord* cord, int count) {
  if (count <= 0) return true;
  if (count <= limit_) {
    if (!input_->ReadCord(cord, count)) return false;
    limit_ -= count;
    return true;
  }
  input_->ReadCord(cord, limit_);
  limit_ = 0;
  return false;
}